

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::NanosecondsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t timetz_func;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  function_statistics_t ts_stats;
  FunctionNullHandling in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbd9;
  code *bind_lambda;
  scalar_function_t local_400;
  scalar_function_t local_3e0;
  scalar_function_t local_3c0;
  LogicalType local_3a0;
  vector<duckdb::LogicalType,_true> local_388;
  LogicalType local_370;
  vector<duckdb::LogicalType,_true> local_358;
  LogicalType local_340;
  LogicalType local_328;
  code *local_310;
  undefined8 local_308;
  code *local_300;
  code *local_2f8;
  scalar_function_t local_2f0;
  scalar_function_t local_2d0;
  LogicalType local_2b0;
  LogicalType local_298;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  LogicalType::LogicalType(&local_328,BIGINT);
  ts_stats = (function_statistics_t)0x1acd91c;
  LogicalType::LogicalType(&local_340,BIGINT);
  bind_lambda = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_3c0.super__Function_base._M_functor._8_8_ = 0;
  local_3c0.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_3c0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3c0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_2d0.super__Function_base._M_functor._8_8_ = 0;
  local_2d0.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_2d0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_2d0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_2f0.super__Function_base._M_functor._8_8_ = 0;
  local_2f0.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_2f0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_2f0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_308 = 0;
  local_310 = ScalarFunction::
              UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_2f8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_300 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::NanosecondsOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = &local_310;
  timetz_func.super__Function_base._M_manager =
       DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker = DatePart::NanosecondsOperator::PropagateStatistics<duckdb::dtime_t>;
  GetGenericTimePartFunction
            (in_RDI,&local_340,(scalar_function_t *)&stack0xfffffffffffffbe0,&local_3c0,&local_2d0,
             &local_2f0,timetz_func,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             (function_statistics_t)CONCAT71(in_stack_fffffffffffffbd9,in_stack_fffffffffffffbd8),
             DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::NanosecondsOperator>);
  if (local_300 != (code *)0x0) {
    (*local_300)(&local_310,&local_310,3);
  }
  if (local_2f0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2f0.super__Function_base._M_manager)
              ((_Any_data *)&local_2f0,(_Any_data *)&local_2f0,__destroy_functor);
  }
  if (local_2d0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2d0.super__Function_base._M_manager)
              ((_Any_data *)&local_2d0,(_Any_data *)&local_2d0,__destroy_functor);
  }
  if (local_3c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3c0.super__Function_base._M_manager)
              ((_Any_data *)&local_3c0,(_Any_data *)&local_3c0,__destroy_functor);
  }
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffbe0,(_Any_data *)&stack0xfffffffffffffbe0,
               __destroy_functor);
  LogicalType::~LogicalType(&local_340);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe0,TIMESTAMP_NS);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffbe0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_358,__l,
             (allocator_type *)&local_3c0);
  LogicalType::LogicalType(&local_370,&local_328);
  local_3e0.super__Function_base._M_functor._8_8_ = 0;
  local_3e0.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_ns_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_3e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_298,INVALID);
  ScalarFunction::ScalarFunction
            (&local_158,&local_358,&local_370,&local_3e0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_ns_t>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_298),CONSISTENT,
             in_stack_fffffffffffffbd8,bind_lambda);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_298);
  if (local_3e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3e0.super__Function_base._M_manager)
              ((_Any_data *)&local_3e0,(_Any_data *)&local_3e0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_370);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_358);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbe0,TIMESTAMP_TZ);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffbe0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_388,__l_00,
             (allocator_type *)&local_3c0);
  LogicalType::LogicalType(&local_3a0,BIGINT);
  local_400.super__Function_base._M_functor._8_8_ = 0;
  local_400.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::NanosecondsOperator>;
  local_400._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_400.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_2b0,INVALID);
  ScalarFunction::ScalarFunction
            (&local_280,&local_388,&local_3a0,&local_400,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             DatePart::NanosecondsOperator::PropagateStatistics<duckdb::timestamp_t>,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_2b0),CONSISTENT,
             in_stack_fffffffffffffbd8,bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2b0);
  if (local_400.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_400.super__Function_base._M_manager)
              ((_Any_data *)&local_400,(_Any_data *)&local_400,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_388);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbe0);
  LogicalType::~LogicalType(&local_328);
  return in_RDI;
}

Assistant:

ScalarFunctionSet NanosecondsFun::GetFunctions() {
	using OP = DatePart::NanosecondsOperator;
	using TR = int64_t;
	const LogicalType &result_type = LogicalType::BIGINT;
	auto operator_set = GetTimePartFunction<OP, TR>();

	auto ns_func = DatePart::UnaryFunction<timestamp_ns_t, TR, OP>;
	auto ns_stats = OP::template PropagateStatistics<timestamp_ns_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_NS}, result_type, ns_func, nullptr, nullptr, ns_stats));

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, TR, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));

	return operator_set;
}